

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  reference pvVar4;
  allocator local_331;
  string local_330 [32];
  undefined1 local_310 [8];
  obb bbox_WXH;
  contained_bbox p3;
  float H;
  float W;
  undefined1 local_240 [8];
  obb min_peri_bbox;
  min_perimeter_bbox p2;
  string local_198 [32];
  undefined1 local_178 [8];
  obb min_area_bbox;
  min_area_bbox p1;
  bbox2d bbox;
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [8];
  c_polygon poly;
  char **argv_local;
  int argc_local;
  
  poly._104_8_ = argv;
  if (argc == 2) {
    masc::polygon::c_polygon::c_polygon((c_polygon *)local_88);
    pcVar1 = *(char **)(poly._104_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar1,&local_a9);
    createPoly((string *)local_a8,(c_polygon *)local_88);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    masc::polygon::bbox2d::bbox2d((bbox2d *)&p1.m_min_area,(c_polygon *)local_88);
    masc::polygon::min_area_bbox::min_area_bbox((min_area_bbox *)&min_area_bbox.width);
    masc::polygon::bbox2d::build
              ((obb *)local_178,(bbox2d *)&p1.m_min_area,(bbox2d_problem *)&min_area_bbox.width);
    poVar3 = std::operator<<((ostream *)&std::cout,"BBox with min area: ");
    poVar3 = masc::polygon::operator<<(poVar3,(obb *)local_178);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"min_area_bbox.svg",(allocator *)&p2.field_0x57);
    pvVar4 = std::__cxx11::list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>::front
                       ((list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_> *)
                        local_88);
    masc::polygon::saveSVG((string *)local_198,pvVar4,(obb *)local_178);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&p2.field_0x57);
    masc::polygon::min_perimeter_bbox::min_perimeter_bbox
              ((min_perimeter_bbox *)&min_peri_bbox.width);
    masc::polygon::bbox2d::build
              ((obb *)local_240,(bbox2d *)&p1.m_min_area,(bbox2d_problem *)&min_peri_bbox.width);
    poVar3 = std::operator<<((ostream *)&std::cout,"BBox with min perimeter: ");
    poVar3 = masc::polygon::operator<<(poVar3,(obb *)local_240);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&W,"min_perimeter_bbox.svg",(allocator *)((long)&H + 3));
    pvVar4 = std::__cxx11::list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>::front
                       ((list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_> *)
                        local_88);
    masc::polygon::saveSVG((string *)&W,pvVar4,(obb *)local_240);
    std::__cxx11::string::~string((string *)&W);
    std::allocator<char>::~allocator((allocator<char> *)((long)&H + 3));
    masc::polygon::contained_bbox::contained_bbox((contained_bbox *)&bbox_WXH.width,28.0,28.0);
    masc::polygon::bbox2d::build
              ((obb *)local_310,(bbox2d *)&p1.m_min_area,(bbox2d_problem *)&bbox_WXH.width);
    bVar2 = masc::polygon::contained_bbox::solved
                      ((contained_bbox *)&bbox_WXH.width,(obb *)local_310);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"BBox contained in ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,28.0);
      poVar3 = std::operator<<(poVar3,"X");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,28.0);
      poVar3 = std::operator<<(poVar3," square: ");
      poVar3 = masc::polygon::operator<<(poVar3,(obb *)local_310);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_330,"contained_bbox.svg",&local_331);
      pvVar4 = std::__cxx11::list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>::
               front((list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_> *)local_88);
      masc::polygon::saveSVG((string *)local_330,pvVar4,(obb *)local_310);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "! Error: Cannot find a bounding box that fits into ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,28.0);
      poVar3 = std::operator<<(poVar3,"X");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,28.0);
      poVar3 = std::operator<<(poVar3," square");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    argv_local._4_4_ = 0;
    masc::polygon::bbox2d::~bbox2d((bbox2d *)&p1.m_min_area);
    masc::polygon::c_polygon::~c_polygon((c_polygon *)local_88);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar3 = std::operator<<(poVar3,*(char **)poly._104_8_);
    poVar3 = std::operator<<(poVar3," polygon");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char ** argv)
{
  if(argc!=2)
  {
    cerr<<"Usage: "<<argv[0]<<" polygon"<<endl;
    return 1;
  }

  //create polygon
  masc::polygon::c_polygon poly;
  createPoly(argv[1],poly);

  //create bbox of the polygon
  masc::polygon::bbox2d bbox(poly);

  //create min-area bbox
  masc::polygon::min_area_bbox p1;
  masc::polygon::obb min_area_bbox = bbox.build(p1);
  cout<<"BBox with min area: "<<min_area_bbox<<endl;
  saveSVG("min_area_bbox.svg",poly.front(),min_area_bbox);

  //build min-perimeter box
  masc::polygon::min_perimeter_bbox p2;
  masc::polygon::obb min_peri_bbox = bbox.build(p2);
  cout<<"BBox with min perimeter: "<<min_peri_bbox<<endl;
  saveSVG("min_perimeter_bbox.svg",poly.front(),min_peri_bbox);

  //build a box that fits into 13X13 square
  float W=28, H=28;
  masc::polygon::contained_bbox p3(W,H);
  masc::polygon::obb bbox_WXH = bbox.build(p3);
  if(p3.solved(bbox_WXH)==false)
    cerr<<"! Error: Cannot find a bounding box that fits into "<<W<<"X"<<H<<" square"<<endl;
  else
  {
    cout<<"BBox contained in "<<W<<"X"<<H<<" square: "<<bbox_WXH<<endl;
    saveSVG("contained_bbox.svg",poly.front(),bbox_WXH);
  }

  return 0;
}